

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall UtestShell::print(UtestShell *this,char *text,char *fileName,size_t lineNumber)

{
  TestResult *pTVar1;
  char *pcVar2;
  SimpleString stringToPrint;
  UtestShell *in_stack_ffffffffffffff88;
  SimpleString *in_stack_ffffffffffffff90;
  SimpleString *in_stack_ffffffffffffffb0;
  char local_30 [48];
  
  pcVar2 = local_30;
  SimpleString::SimpleString(in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
  SimpleString::operator+=(in_stack_ffffffffffffffb0,pcVar2);
  SimpleString::operator+=(in_stack_ffffffffffffffb0,pcVar2);
  StringFrom((unsigned_long)in_stack_ffffffffffffff88);
  SimpleString::operator+=(in_stack_ffffffffffffff90,(SimpleString *)in_stack_ffffffffffffff88);
  SimpleString::~SimpleString((SimpleString *)0x1891a8);
  SimpleString::operator+=(in_stack_ffffffffffffffb0,pcVar2);
  SimpleString::operator+=(in_stack_ffffffffffffffb0,pcVar2);
  pTVar1 = getTestResult(in_stack_ffffffffffffff88);
  pcVar2 = SimpleString::asCharString((SimpleString *)0x1891e7);
  (*pTVar1->_vptr_TestResult[0xe])(pTVar1,pcVar2);
  SimpleString::~SimpleString((SimpleString *)0x18920d);
  return;
}

Assistant:

void UtestShell::print(const char *text, const char* fileName, size_t lineNumber)
{
    SimpleString stringToPrint = "\n";
    stringToPrint += fileName;
    stringToPrint += ":";
    stringToPrint += StringFrom(lineNumber);
    stringToPrint += " ";
    stringToPrint += text;
    getTestResult()->print(stringToPrint.asCharString());
}